

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger array_map(HSQUIRRELVM v)

{
  SQArray *x;
  SQObjectPtr *o_00;
  SQObjectPtr ret;
  SQInteger size;
  SQObject *o;
  HSQUIRRELVM in_stack_00000088;
  SQArray *in_stack_00000090;
  SQArray *in_stack_00000098;
  SQInteger in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  SQObjectPtr local_30;
  SQInteger local_20;
  SQObjectPtr *local_18;
  SQInteger local_8;
  
  local_18 = stack_get((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
  local_20 = SQArray::Size((SQArray *)0x11ec0b);
  x = SQArray::Create((SQSharedState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                      ,in_stack_ffffffffffffffb8);
  SQObjectPtr::SQObjectPtr(&local_30,x);
  o_00 = (SQObjectPtr *)__map_array(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  if ((long)o_00 < 0) {
    local_8 = -1;
  }
  else {
    SQVM::Push((SQVM *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),o_00);
    local_8 = 1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffc4,1));
  return local_8;
}

Assistant:

static SQInteger array_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQInteger size = _array(o)->Size();
    SQObjectPtr ret = SQArray::Create(_ss(v),size);
    if(SQ_FAILED(__map_array(_array(ret),_array(o),v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}